

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_time_GetTime::test_method(util_time_GetTime *this)

{
  bool bVar1;
  strong_ordering sVar2;
  strong_ordering sVar3;
  const_iterator pdVar4;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000L>_> *num_sleep;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *__range1;
  duration<long,_std::ratio<1L,_1000000L>_> us_0;
  duration<long,_std::ratio<1L,_1000L>_> ms_0;
  time_point steady_0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  steady_ms_0;
  char *in_stack_fffffffffffff788;
  lazy_ostream *in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffff7a0;
  const_string *in_stack_fffffffffffff7b0;
  const_string *msg;
  size_t in_stack_fffffffffffff7b8;
  undefined1 *line_num;
  lazy_ostream *in_stack_fffffffffffff7c0;
  unit_test_log_t *in_stack_fffffffffffff7c8;
  unit_test_log_t *this_00;
  const_iterator local_5d0;
  const_string local_5b8 [2];
  lazy_ostream local_598 [2];
  rep local_570;
  assertion_result local_568;
  undefined1 local_550 [16];
  const_string local_540;
  const_string local_530 [2];
  lazy_ostream local_510 [2];
  rep local_4e8;
  assertion_result local_4e0 [2];
  const_string local_4a8 [2];
  lazy_ostream local_488 [2];
  undefined8 local_460;
  rep local_458;
  duration local_450;
  assertion_result local_448 [2];
  const_string local_410 [2];
  lazy_ostream local_3f0 [2];
  duration local_3c8;
  assertion_result local_3c0 [2];
  rep local_388;
  rep local_378;
  rep local_370;
  undefined8 local_368;
  duration local_360;
  rep local_358;
  lazy_ostream local_350;
  undefined1 local_340 [16];
  undefined1 local_330 [64];
  lazy_ostream local_2f0;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [64];
  rep local_290;
  lazy_ostream local_288;
  undefined1 local_278 [16];
  undefined1 local_268 [64];
  rep local_228;
  lazy_ostream local_220;
  undefined1 local_210 [16];
  undefined1 local_200 [64];
  lazy_ostream local_1c0;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [64];
  lazy_ostream local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [64];
  duration local_100;
  rep local_f8;
  lazy_ostream local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [64];
  lazy_ostream local_90;
  undefined1 local_80 [16];
  undefined1 local_70 [72];
  rep *local_28;
  undefined8 local_20;
  rep local_18;
  rep local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SetMockTime((int64_t)in_stack_fffffffffffff788);
  local_18 = (rep)ms<(char)48>();
  local_10 = (rep)ms<(char)49>();
  local_28 = &local_18;
  local_20 = 2;
  local_5d0 = std::initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::begin
                        ((initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                         in_stack_fffffffffffff788);
  pdVar4 = std::initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::end
                     ((initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
                      in_stack_fffffffffffff798);
  for (; local_5d0 != pdVar4; local_5d0 = local_5d0 + 1) {
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff790,
               (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff788);
    UninterruptibleSleep((microseconds *)in_stack_fffffffffffff788);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_90._12_4_ = 0x6f;
      local_90._vptr_lazy_ostream = (_func_int **)GetTime();
      in_stack_fffffffffffff798 = "GetTime()";
      in_stack_fffffffffffff790 = &local_90;
      in_stack_fffffffffffff788 = "111";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_70,local_80,0x21a,1,2,&local_90.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_f0._12_4_ = 0x6f;
      local_100.__r =
           (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                          ();
      local_f8 = (rep)std::chrono::
                      time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
                      time_since_epoch((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                        *)in_stack_fffffffffffff790);
      local_f0._vptr_lazy_ostream =
           (_func_int **)
           std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                     ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff788);
      in_stack_fffffffffffff798 = "Now<NodeSeconds>().time_since_epoch().count()";
      in_stack_fffffffffffff790 = &local_f0;
      in_stack_fffffffffffff788 = "111";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_d0,local_e0,0x21b,1,2,&local_f0.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_160._12_4_ = 0x6f;
      NodeClock::now();
      local_160._vptr_lazy_ostream =
           (_func_int **)
           TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                     ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       )in_stack_fffffffffffff798);
      in_stack_fffffffffffff798 = "TicksSinceEpoch<std::chrono::seconds>(NodeClock::now())";
      in_stack_fffffffffffff790 = &local_160;
      in_stack_fffffffffffff788 = "111";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_140,local_150,0x21c,1,2,&local_160.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_1c0._12_4_ = 0x6f;
      Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
      local_1c0._vptr_lazy_ostream =
           (_func_int **)
           TicksSinceEpoch<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                     ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>)
                      in_stack_fffffffffffff798);
      in_stack_fffffffffffff798 = "TicksSinceEpoch<SecondsDouble>(Now<NodeSeconds>())";
      in_stack_fffffffffffff790 = &local_1c0;
      in_stack_fffffffffffff788 = "111";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,double>
                (local_1a0,local_1b0,0x21d,1,2,&local_1c0.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_220._12_4_ = 0x6f;
      local_228 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
      local_220._vptr_lazy_ostream =
           (_func_int **)
           std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                     ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff788);
      in_stack_fffffffffffff798 = "GetTime<std::chrono::seconds>().count()";
      in_stack_fffffffffffff790 = &local_220;
      in_stack_fffffffffffff788 = "111";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_200,local_210,0x21e,1,2,&local_220.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_288._12_4_ = 0x1b198;
      local_290 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
      local_288._vptr_lazy_ostream =
           (_func_int **)
           std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                     ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff788);
      in_stack_fffffffffffff798 = "GetTime<std::chrono::milliseconds>().count()";
      in_stack_fffffffffffff790 = &local_288;
      in_stack_fffffffffffff788 = "111000";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_268,local_278,0x21f,1,2,&local_288.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_2f0._12_4_ = 0x1b198;
      NodeClock::now();
      local_2f0._vptr_lazy_ostream =
           (_func_int **)
           TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                     ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       )in_stack_fffffffffffff798);
      in_stack_fffffffffffff798 = "TicksSinceEpoch<std::chrono::milliseconds>(NodeClock::now())";
      in_stack_fffffffffffff790 = &local_2f0;
      in_stack_fffffffffffff788 = "111000";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_2d0,local_2e0,0x220,1,2,&local_2f0.field_0xc);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff790,(char (*) [1])in_stack_fffffffffffff788);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
                 (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
      local_350._12_4_ = 111000000;
      local_358 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
      local_350._vptr_lazy_ostream =
           (_func_int **)
           std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                     ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff788);
      in_stack_fffffffffffff798 = "GetTime<std::chrono::microseconds>().count()";
      in_stack_fffffffffffff790 = &local_350;
      in_stack_fffffffffffff788 = "111000000";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
                (local_330,local_340,0x221,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff788);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  SetMockTime((int64_t)in_stack_fffffffffffff788);
  local_360.__r =
       (rep)Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                      ();
  local_368 = std::chrono::_V2::steady_clock::now();
  local_370 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
  local_378 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
  local_388 = (rep)ms<(char)49>();
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff790,
             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff788);
  UninterruptibleSleep((microseconds *)in_stack_fffffffffffff788);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
               in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    local_3c8.__r =
         (rep)Now<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                        ();
    sVar2 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                        *)in_stack_fffffffffffff790,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                        *)in_stack_fffffffffffff788);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffff788,(__unspec *)0xc269eb);
    std::operator<(sVar2._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff798,
               SUB81((ulong)in_stack_fffffffffffff790 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff790,(basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    in_stack_fffffffffffff788 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c0,local_3f0,local_410,0x22b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff788);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff788);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff7c8,(const_string *)in_stack_fffffffffffff7c0,
               in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    local_458 = (rep)ms<(char)49>();
    local_450.__r =
         (rep)std::chrono::operator+
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff790,
                         (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff788);
    local_460 = std::chrono::_V2::steady_clock::now();
    sVar2 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff790,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff788);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffff788,(__unspec *)0xc26b88);
    std::operator<=(sVar2._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff798,
               SUB81((ulong)in_stack_fffffffffffff790 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff790,(basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    in_stack_fffffffffffff788 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_448,local_488,local_4a8,0x22c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff788);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff788);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
               in_stack_fffffffffffff7b0);
    local_4e8 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
    sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                      (in_stack_fffffffffffff7a0,
                       (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff798);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffff788,(__unspec *)0xc26cf5);
    std::operator<(sVar2._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff798,
               SUB81((ulong)in_stack_fffffffffffff790 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff790,(basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    in_stack_fffffffffffff788 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4e0,local_510,local_530,0x22d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff788);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff788);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = &local_540;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    line_num = local_550;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_fffffffffffff7c0,(size_t)line_num,msg);
    local_570 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
    sVar3 = _GLOBAL__N_1::std::chrono::
            operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                      ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff7a0,
                       (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffff798);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffff788,(__unspec *)0xc26e62);
    std::operator<(sVar3._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff798,
               SUB81((ulong)in_stack_fffffffffffff790 >> 0x38,0));
    in_stack_fffffffffffff7c0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff790,(basic_cstring<const_char> *)in_stack_fffffffffffff788);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798,
               (pointer)in_stack_fffffffffffff790,(unsigned_long)in_stack_fffffffffffff788);
    in_stack_fffffffffffff788 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_568,local_598,local_5b8,0x22e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff788);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff788);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_time_GetTime)
{
    SetMockTime(111);
    // Check that mock time does not change after a sleep
    for (const auto& num_sleep : {0ms, 1ms}) {
        UninterruptibleSleep(num_sleep);
        BOOST_CHECK_EQUAL(111, GetTime()); // Deprecated time getter
        BOOST_CHECK_EQUAL(111, Now<NodeSeconds>().time_since_epoch().count());
        BOOST_CHECK_EQUAL(111, TicksSinceEpoch<std::chrono::seconds>(NodeClock::now()));
        BOOST_CHECK_EQUAL(111, TicksSinceEpoch<SecondsDouble>(Now<NodeSeconds>()));
        BOOST_CHECK_EQUAL(111, GetTime<std::chrono::seconds>().count());
        BOOST_CHECK_EQUAL(111000, GetTime<std::chrono::milliseconds>().count());
        BOOST_CHECK_EQUAL(111000, TicksSinceEpoch<std::chrono::milliseconds>(NodeClock::now()));
        BOOST_CHECK_EQUAL(111000000, GetTime<std::chrono::microseconds>().count());
    }

    SetMockTime(0);
    // Check that steady time and system time changes after a sleep
    const auto steady_ms_0 = Now<SteadyMilliseconds>();
    const auto steady_0 = std::chrono::steady_clock::now();
    const auto ms_0 = GetTime<std::chrono::milliseconds>();
    const auto us_0 = GetTime<std::chrono::microseconds>();
    UninterruptibleSleep(1ms);
    BOOST_CHECK(steady_ms_0 < Now<SteadyMilliseconds>());
    BOOST_CHECK(steady_0 + 1ms <= std::chrono::steady_clock::now());
    BOOST_CHECK(ms_0 < GetTime<std::chrono::milliseconds>());
    BOOST_CHECK(us_0 < GetTime<std::chrono::microseconds>());
}